

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostl.c
# Opt level: O3

int trico_read_stl(uint32_t *nr_of_vertices,float **vertices,uint32_t *nr_of_triangles,
                  uint32_t **triangles,char *filename)

{
  uint32_t uVar1;
  int iVar2;
  FILE *__stream;
  uint32_t *puVar3;
  float *pfVar4;
  uint32_t nr_of_triangles_00;
  int iVar5;
  char buffer [80];
  int local_88;
  char cStack_84;
  undefined8 uStack_7c;
  undefined8 uStack_74;
  undefined8 local_6c;
  undefined8 uStack_64;
  float local_5c;
  
  iVar5 = 0;
  *vertices = (float *)0x0;
  *triangles = (uint32_t *)0x0;
  *nr_of_vertices = 0;
  *nr_of_triangles = 0;
  __stream = fopen(filename,"rb");
  if (__stream != (FILE *)0x0) {
    fread(&local_88,1,0x50,__stream);
    if ((local_88 == 0x696c6f73) && (cStack_84 == 'd')) {
      fclose(__stream);
      iVar5 = 0;
    }
    else {
      fread(nr_of_triangles,4,1,__stream);
      puVar3 = (uint32_t *)malloc((ulong)(*nr_of_triangles * 3) << 2);
      *triangles = puVar3;
      *nr_of_vertices = 0;
      pfVar4 = (float *)malloc((ulong)(*nr_of_triangles * 9) << 2);
      *vertices = pfVar4;
      puVar3 = *triangles;
      iVar2 = feof(__stream);
      iVar5 = 0;
      nr_of_triangles_00 = 0;
      if (iVar2 == 0) {
        nr_of_triangles_00 = 0;
        do {
          if (*nr_of_triangles <= nr_of_triangles_00) break;
          nr_of_triangles_00 = nr_of_triangles_00 + 1;
          fread(&local_88,1,0x32,__stream);
          *(undefined8 *)pfVar4 = uStack_7c;
          *(undefined8 *)(pfVar4 + 2) = uStack_74;
          *(undefined8 *)(pfVar4 + 4) = local_6c;
          *(undefined8 *)(pfVar4 + 6) = uStack_64;
          pfVar4[8] = local_5c;
          uVar1 = *nr_of_vertices;
          *nr_of_vertices = uVar1 + 1;
          *puVar3 = uVar1;
          uVar1 = *nr_of_vertices;
          *nr_of_vertices = uVar1 + 1;
          puVar3[1] = uVar1;
          uVar1 = *nr_of_vertices;
          *nr_of_vertices = uVar1 + 1;
          puVar3[2] = uVar1;
          puVar3 = puVar3 + 3;
          iVar2 = feof(__stream);
          pfVar4 = pfVar4 + 9;
        } while (iVar2 == 0);
      }
      fclose(__stream);
      if (nr_of_triangles_00 == *nr_of_triangles) {
        trico_remove_duplicate_vertices(nr_of_vertices,vertices,nr_of_triangles_00,triangles);
        pfVar4 = (float *)realloc(*vertices,(ulong)(*nr_of_vertices * 3) << 2);
        *vertices = pfVar4;
        iVar5 = 1;
      }
    }
  }
  return iVar5;
}

Assistant:

int trico_read_stl(uint32_t* nr_of_vertices, float** vertices, uint32_t* nr_of_triangles, uint32_t** triangles, const char* filename)
  {
  *vertices = NULL;
  *triangles = NULL;
  *nr_of_vertices = 0;
  *nr_of_triangles = 0;
  FILE* inputfile = fopen(filename, "rb");
  if (!inputfile)
    return 0;

  if (!inputfile)
    return 0;

  char buffer[80];
  fread(buffer, 1, 80, inputfile);

  if (buffer[0] == 's' && buffer[1] == 'o' && buffer[2] == 'l' && buffer[3] == 'i' && buffer[4] == 'd')
    {
    fclose(inputfile);
    return 0;
    }

  fread((void*)(nr_of_triangles), sizeof(uint32_t), 1, inputfile);
  *triangles = (uint32_t*)trico_malloc(*nr_of_triangles * 3 * sizeof(uint32_t));
  uint32_t count_triangles = 0;
  *nr_of_vertices = 0;
  *vertices = (float*)trico_malloc(*nr_of_triangles * 9 * sizeof(float));

  uint32_t* tria_it = *triangles;
  float* vert_it = *vertices;
  while (!feof(inputfile) && count_triangles < *nr_of_triangles)
    {
    ++count_triangles;
    fread(buffer, 1, 50, inputfile);
    *vert_it++ = *(float*)(&(buffer[12]));
    *vert_it++ = *(float*)(&(buffer[16]));
    *vert_it++ = *(float*)(&(buffer[20]));
    *vert_it++ = *(float*)(&(buffer[24]));
    *vert_it++ = *(float*)(&(buffer[28]));
    *vert_it++ = *(float*)(&(buffer[32]));
    *vert_it++ = *(float*)(&(buffer[36]));
    *vert_it++ = *(float*)(&(buffer[40]));
    *vert_it++ = *(float*)(&(buffer[44]));
    *tria_it++ = (*nr_of_vertices)++;
    *tria_it++ = (*nr_of_vertices)++;
    *tria_it++ = (*nr_of_vertices)++;
    }
  fclose(inputfile);
  if (count_triangles != *nr_of_triangles)
    return 0;

  trico_remove_duplicate_vertices(nr_of_vertices, vertices, *nr_of_triangles, triangles);
  *vertices = (float*)trico_realloc(*vertices, *nr_of_vertices * 3 * sizeof(float));
  return 1;
  }